

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *xpr)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  Index index_1;
  long lVar4;
  long lVar5;
  long lVar6;
  Scalar SVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar1 = (xpr->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  lVar6 = 4;
  lVar4 = lVar1 / 4;
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
           data;
  if (lVar1 + 1U < 3) {
    pdVar3 = (eval->
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ).
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
             data;
    SVar7 = *pdVar2 * *pdVar3;
    for (lVar6 = 1; lVar6 < lVar1; lVar6 = lVar6 + 1) {
      SVar7 = SVar7 + pdVar2[lVar6] * pdVar3[lVar6];
    }
  }
  else {
    lVar5 = (lVar1 / 2) * 2;
    pdVar3 = (eval->
             super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ).
             super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
             data;
    dVar10 = *pdVar2 * *pdVar3;
    dVar11 = pdVar2[1] * pdVar3[1];
    if (3 < lVar1) {
      dVar8 = pdVar2[2] * pdVar3[2];
      dVar9 = pdVar2[3] * pdVar3[3];
      for (; lVar6 < lVar4 * 4; lVar6 = lVar6 + 4) {
        dVar10 = dVar10 + pdVar2[lVar6] * pdVar3[lVar6];
        dVar11 = dVar11 + (pdVar2 + lVar6)[1] * (pdVar3 + lVar6)[1];
        dVar8 = dVar8 + (pdVar2 + 2)[lVar6] * (pdVar3 + 2)[lVar6];
        dVar9 = dVar9 + (pdVar2 + 2 + lVar6)[1] * (pdVar3 + 2 + lVar6)[1];
      }
      dVar10 = dVar10 + dVar8;
      dVar11 = dVar11 + dVar9;
      if (lVar4 * 4 < lVar5) {
        dVar10 = dVar10 + pdVar2[lVar4 * 4] * pdVar3[lVar4 * 4];
        dVar11 = dVar11 + (pdVar2 + lVar4 * 4)[1] * (pdVar3 + lVar4 * 4)[1];
      }
    }
    SVar7 = dVar11 + dVar10;
    for (; lVar5 < lVar1; lVar5 = lVar5 + 1) {
      SVar7 = SVar7 + pdVar2[lVar5] * pdVar3[lVar5];
    }
  }
  return SVar7;
}

Assistant:

EIGEN_CONSTEXPR
    Index rows() const EIGEN_NOEXCEPT {
      // return the fixed size type if available to enable compile time optimizations
      return internal::traits<typename internal::remove_all<LhsNested>::type>::RowsAtCompileTime==Dynamic ? m_rhs.rows() : m_lhs.rows();
    }